

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serial.cc
# Opt level: O2

ssize_t __thiscall serial::Serial::read(Serial *this,int __fd,void *__buf,size_t __nbytes)

{
  void *pvVar1;
  ssize_t sVar2;
  undefined4 in_register_00000034;
  ScopedReadLock lock;
  ScopedReadLock local_28;
  
  local_28.pimpl_ = this->pimpl_;
  SerialImpl::readLock(local_28.pimpl_);
  pvVar1 = operator_new__((ulong)__buf);
  sVar2 = SerialImpl::read(this->pimpl_,(int)pvVar1,__buf,__nbytes);
  std::__cxx11::string::append((char *)CONCAT44(in_register_00000034,__fd),(ulong)pvVar1);
  operator_delete__(pvVar1);
  ScopedReadLock::~ScopedReadLock(&local_28);
  return sVar2;
}

Assistant:

size_t
Serial::read (std::string &buffer, size_t size)
{
  ScopedReadLock lock(this->pimpl_);
  uint8_t *buffer_ = new uint8_t[size];
  size_t bytes_read = 0;
  try {
    bytes_read = this->pimpl_->read (buffer_, size);
  }
  catch (const std::exception &e) {
    delete[] buffer_;
    throw;
  }
  buffer.append (reinterpret_cast<const char*>(buffer_), bytes_read);
  delete[] buffer_;
  return bytes_read;
}